

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_integer_multiply(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  _Bool _Var1;
  sysbvm_stuple_t sVar2;
  sysbvm_stuple_t sVar3;
  size_t resultWordCount_00;
  sysbvm_object_tuple_t *integer;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t local_b0;
  sysbvm_integer_t *result;
  size_t resultWordCount;
  undefined1 local_80 [7];
  _Bool resultIsNegative;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  sysbvm_stuple_t result_1;
  sysbvm_stuple_t rightValue;
  sysbvm_stuple_t leftValue;
  sysbvm_tuple_t right_local;
  sysbvm_tuple_t left_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(left);
  if ((_Var1) && (_Var1 = sysbvm_tuple_isImmediate(right), _Var1)) {
    sVar2 = sysbvm_tuple_integer_decodeSmall(left);
    sVar3 = sysbvm_tuple_integer_decodeSmall(right);
    if ((sVar2 == 0) || ((sVar3 == 0 || (sVar2 == (sVar2 * sVar3) / sVar3)))) {
      sVar4 = sysbvm_tuple_integer_encodeInt64(context,sVar2 * sVar3);
      return sVar4;
    }
  }
  memset(decodedRightInteger.inlineWordBuffer,0,0x20);
  memset(local_80,0,0x20);
  sysbvm_integer_decodeLargeOrImmediate
            (context,(sysbvm_decoded_integer_t *)decodedRightInteger.inlineWordBuffer,left);
  sysbvm_integer_decodeLargeOrImmediate(context,(sysbvm_decoded_integer_t *)local_80,right);
  resultWordCount_00 = decodedLeftInteger._0_8_ + decodedRightInteger._0_8_ + 1;
  if (((byte)decodedRightInteger.inlineWordBuffer[0] & 1) == (local_80[0] & 1U)) {
    local_b0 = (context->roots).largePositiveIntegerType;
  }
  else {
    local_b0 = (context->roots).largeNegativeIntegerType;
  }
  integer = sysbvm_context_allocateByteTuple(context,local_b0,resultWordCount_00 * 4);
  sysbvm_integer_multiplyInto
            (decodedLeftInteger._0_8_,(uint32_t *)decodedLeftInteger.wordCount,
             decodedRightInteger._0_8_,(uint32_t *)decodedRightInteger.wordCount,resultWordCount_00,
             (uint32_t *)(integer->field_1).pointers);
  sVar4 = sysbvm_integer_normalize(context,(sysbvm_integer_t *)integer);
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_multiply(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);

        sysbvm_stuple_t result = leftValue * rightValue;
        if(leftValue == 0 || rightValue == 0 || leftValue == result / rightValue)
            return sysbvm_tuple_integer_encodeInt64(context, leftValue * rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    bool resultIsNegative = decodedLeftInteger.isNegative != decodedRightInteger.isNegative;
    size_t resultWordCount = decodedLeftInteger.wordCount + decodedRightInteger.wordCount + 1;
    sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
    sysbvm_integer_multiplyInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
    return sysbvm_integer_normalize(context, result);
}